

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

void __thiscall iDynTree::KinDynComputations::computeFwdKinematics(KinDynComputations *this)

{
  byte bVar1;
  long in_RDI;
  bool ok;
  
  if ((*(byte *)(*(long *)(in_RDI + 8) + 0x2f0) & 1) == 0) {
    bVar1 = iDynTree::ForwardPosVelKinematics
                      ((Model *)(*(long *)(in_RDI + 8) + 8),
                       (Traversal *)(*(long *)(in_RDI + 8) + 0x138),
                       (FreeFloatingPos *)(*(long *)(in_RDI + 8) + 0x1b0),
                       (FreeFloatingVel *)(*(long *)(in_RDI + 8) + 0x238),
                       (LinkPositions *)(*(long *)(in_RDI + 8) + 0x2f8),
                       (LinkVelArray *)(*(long *)(in_RDI + 8) + 0x310));
    *(byte *)(*(long *)(in_RDI + 8) + 0x2f0) = bVar1 & 1;
  }
  return;
}

Assistant:

void KinDynComputations::computeFwdKinematics()
{
    if( this->pimpl->m_isFwdKinematicsUpdated )
    {
        return;
    }

    // Compute position and velocity kinematics
    bool ok = ForwardPosVelKinematics(this->pimpl->m_robot_model,
                                      this->pimpl->m_traversal,
                                      this->pimpl->m_pos,
                                      this->pimpl->m_vel,
                                      this->pimpl->m_linkPos,
                                      this->pimpl->m_linkVel);

    this->pimpl->m_isFwdKinematicsUpdated = ok;
}